

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

void __thiscall
duckdb::GlobMultiFileList::GlobMultiFileList
          (GlobMultiFileList *this,ClientContext *context_p,
          vector<duckdb::OpenFileInfo,_true> *paths_p,FileGlobOptions options)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer pOVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  pOVar1 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pOVar2 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__MultiFileList_027a4480;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = pOVar2;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar3;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pOVar1;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  (this->super_MultiFileList).glob_options = options;
  ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_28);
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__GlobMultiFileList_027a4530;
  this->context = context_p;
  this->current_path = 0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

GlobMultiFileList::GlobMultiFileList(ClientContext &context_p, vector<OpenFileInfo> paths_p, FileGlobOptions options)
    : MultiFileList(std::move(paths_p), options), context(context_p), current_path(0) {
}